

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilist_node.h
# Opt level: O2

void __thiscall
spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
          (IntrusiveNodeBase<spvtools::opt::Instruction> *this,Instruction *pos)

{
  if (this->is_sentinel_ == true) {
    __assert_fail("!this->is_sentinel_ && \"Sentinel nodes cannot be moved around.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                  ,0xae,
                  "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
                 );
  }
  if ((pos->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ != (Instruction *)0x0) {
    if (this->next_node_ != (Instruction *)0x0) {
      RemoveFromList(this);
    }
    this->next_node_ = pos;
    this->previous_node_ = (pos->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_
    ;
    (pos->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_ = (Instruction *)this;
    (this->previous_node_->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_ =
         (Instruction *)this;
    return;
  }
  __assert_fail("pos->IsInAList() && \"Pos should already be in a list.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/util/ilist_node.h"
                ,0xaf,
                "void spvtools::utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore(NodeType *) [NodeType = spvtools::opt::Instruction]"
               );
}

Assistant:

inline void IntrusiveNodeBase<NodeType>::InsertBefore(NodeType* pos) {
  assert(!this->is_sentinel_ && "Sentinel nodes cannot be moved around.");
  assert(pos->IsInAList() && "Pos should already be in a list.");
  if (this->IsInAList()) this->RemoveFromList();

  this->next_node_ = pos;
  this->previous_node_ = pos->previous_node_;
  pos->previous_node_ = static_cast<NodeType*>(this);
  this->previous_node_->next_node_ = static_cast<NodeType*>(this);
}